

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O2

void __thiscall CppGenerator::genComputeGroupFiles(CppGenerator *this,size_t group)

{
  ostream *poVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  string local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  string local_270;
  string local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  ofstream ofs;
  
  std::operator+(&local_2f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_,"ComputeGroup");
  std::__cxx11::to_string(&local_2b0,group);
  std::operator+(&local_2d0,&local_2f0,&local_2b0);
  std::operator+(&local_310,&local_2d0,".h");
  std::ofstream::ofstream(&ofs,(string *)&local_310,_S_out);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::to_string(&local_250,group);
  std::operator+(&local_230,"#ifndef INCLUDE_COMPUTEGROUP",&local_250);
  std::operator+(&local_290,&local_230,"_HPP_\n");
  std::operator+(&local_2b0,&local_290,"#define INCLUDE_COMPUTEGROUP");
  std::__cxx11::to_string(&local_270,group);
  std::operator+(&local_2f0,&local_2b0,&local_270);
  std::operator+(&local_2d0,&local_2f0,"_HPP_\n\n");
  std::operator+(&local_310,&local_2d0,"#include \"DataHandler.h\"\n\nnamespace lmfao\n{\n");
  std::operator<<((ostream *)&ofs,(string *)&local_310);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_250);
  if (this->_parallelizeGroup[group] == true) {
    offset_abi_cxx11_(&local_2b0,this,1);
    std::operator+(&local_2f0,&local_2b0,"void computeGroup");
    std::__cxx11::to_string(&local_290,group);
    std::operator+(&local_2d0,&local_2f0,&local_290);
    std::operator+(&local_310,&local_2d0,"();\n");
    std::operator<<((ostream *)&ofs,(string *)&local_310);
  }
  else {
    offset_abi_cxx11_(&local_2b0,this,1);
    std::operator+(&local_2f0,&local_2b0,"void computeGroup");
    std::__cxx11::to_string(&local_290,group);
    std::operator+(&local_2d0,&local_2f0,&local_290);
    std::operator+(&local_310,&local_2d0,"();\n");
    std::operator<<((ostream *)&ofs,(string *)&local_310);
  }
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::to_string(&local_2f0,group);
  std::operator+(&local_2d0,"}\n\n#endif /* INCLUDE_COMPUTEGROUP",&local_2f0);
  std::operator+(&local_310,&local_2d0,"_HPP_*/\n");
  std::operator<<((ostream *)&ofs,(string *)&local_310);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::ofstream::close();
  std::operator+(&local_2f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_,"ComputeGroup");
  std::__cxx11::to_string(&local_2b0,group);
  std::operator+(&local_2d0,&local_2f0,&local_2b0);
  std::operator+(&local_310,&local_2d0,".cpp");
  std::ofstream::open((string *)&ofs,(_Ios_Openmode)&local_310);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::to_string(&local_2f0,group);
  std::operator+(&local_2d0,"#include \"ComputeGroup",&local_2f0);
  std::operator+(&local_310,&local_2d0,".h\"\n");
  std::operator<<((ostream *)&ofs,(string *)&local_310);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_2f0);
  if (this->_hasDynamicFunctions == true) {
    std::operator<<((ostream *)&ofs,"#include \"DynamicFunctions.h\"\n");
  }
  std::operator<<((ostream *)&ofs,"namespace lmfao\n{\n");
  genComputeGroupFunction_abi_cxx11_(&local_310,this,group);
  poVar1 = std::operator<<((ostream *)&ofs,(string *)&local_310);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_310);
  std::operator<<((ostream *)&ofs,"}\n");
  std::ofstream::close();
  std::ofstream::~ofstream(&ofs);
  return;
}

Assistant:

void CppGenerator::genComputeGroupFiles(size_t group)
{
    std::ofstream ofs(multifaq::dir::OUTPUT_DIRECTORY+"ComputeGroup"+std::to_string(group)+".h",
                      std::ofstream::out);

    ofs << "#ifndef INCLUDE_COMPUTEGROUP"+std::to_string(group)+"_HPP_\n"+
        "#define INCLUDE_COMPUTEGROUP"+std::to_string(group)+"_HPP_\n\n"+
        "#include \"DataHandler.h\"\n\nnamespace lmfao\n{\n";
    if (_parallelizeGroup[group])
    {
        // ofs << offset(1)+"void computeGroup"+std::to_string(group)+"(";

        // for (const size_t& viewID : viewGroups[group])
        // {
        //     ofs << "std::vector<"+viewName[viewID]+"_tuple>& "+viewName[viewID]+",";
        //     if (_requireHashing[viewID])
        //     {
        //         ofs << "std::unordered_map<"+viewName[viewID]+"_key,"+
        //             "size_t, "+viewName[viewID]+"_keyhash>& "+viewName[viewID]+"_map,";
        //     }
        // }
        // ofs << "size_t lowerptr, size_t upperptr);\n";
        // ofs << offset(1)+"void
        // computeGroup"+std::to_string(group)+"Parallelized();\n";
         ofs << offset(1)+"void computeGroup"+std::to_string(group)+"();\n";
    }
    else
    {
        ofs << offset(1)+"void computeGroup"+std::to_string(group)+"();\n"; 
    }
    
    ofs << "}\n\n#endif /* INCLUDE_COMPUTEGROUP"+std::to_string(group)+"_HPP_*/\n";
    ofs.close();
        
    ofs.open(multifaq::dir::OUTPUT_DIRECTORY+"ComputeGroup"+std::to_string(group)+".cpp",
             std::ofstream::out);

    // TODO:TODO:TODO: We should avoid including DynamicFunctions.h if it is not
    // needed.
    
    ofs << "#include \"ComputeGroup"+std::to_string(group)+".h\"\n";

    if (_hasDynamicFunctions)
        ofs << "#include \"DynamicFunctions.h\"\n";
    
    ofs << "namespace lmfao\n{\n";
    ofs << genComputeGroupFunction(group) << std::endl;
    ofs << "}\n";
    ofs.close();
}